

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

BasicBlock * __thiscall
FlowGraph::InsertCompensationCodeForBlockMove
          (FlowGraph *this,FlowEdge *edge,bool insertToLoopList,bool sinkBlockLoop,bool afterForward
          )

{
  RealCount *pRVar1;
  IRKind IVar2;
  OpCode OVar3;
  uint uVar4;
  BasicBlock *targetBlock;
  BasicBlock *pBVar5;
  BasicBlock *targetBlock_00;
  BranchInstr *this_00;
  Loop *pLVar6;
  LabelInstr *branchTarget;
  Func *func;
  LabelInstr *pLVar7;
  code *pcVar8;
  bool bVar9;
  ExecutionMode EVar10;
  ushort uVar11;
  BOOL BVar12;
  BasicBlock *compBlock;
  Func **ppFVar13;
  BasicBlock *pBVar14;
  Type pSVar15;
  undefined4 *puVar16;
  LabelInstr *newLabelInstr;
  BranchInstr *this_01;
  MultiBranchInstr *this_02;
  char *pcVar17;
  undefined7 in_register_00000011;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  BasicBlock *blNext;
  Loop **ppLVar21;
  BranchInstr *sourceBr;
  
  compBlock = BasicBlock::New(this);
  targetBlock = edge->predBlock;
  pBVar5 = targetBlock->next;
  ppFVar13 = (Func **)&pBVar5->firstInstr;
  if (pBVar5 == (BasicBlock *)0x0) {
    ppFVar13 = &targetBlock->func;
  }
  lVar18 = 0x18;
  if (pBVar5 == (BasicBlock *)0x0) {
    lVar18 = 0xd0;
  }
  targetBlock_00 = edge->succBlock;
  this_00 = *(BranchInstr **)((long)&(*ppFVar13)->m_alloc + lVar18);
  uVar4 = this->blockCount;
  this->blockCount = uVar4 + 1;
  compBlock->number = uVar4;
  if ((int)CONCAT71(in_register_00000011,insertToLoopList) != 0) {
    if (sinkBlockLoop) {
      ppLVar21 = &targetBlock_00->loop;
      if ((targetBlock_00->loop != (Loop *)0x0) &&
         (pBVar14 = Loop::GetHeadBlock(targetBlock_00->loop), pBVar14 == targetBlock_00)) {
        ppLVar21 = &(*ppLVar21)->parent;
      }
      pLVar6 = *ppLVar21;
      compBlock->loop = pLVar6;
      InsertCompBlockToLoopList(this,pLVar6,compBlock,targetBlock_00,false);
      uVar11 = 0x400;
    }
    else {
      pLVar6 = targetBlock->loop;
      compBlock->loop = pLVar6;
      InsertCompBlockToLoopList(this,pLVar6,compBlock,targetBlock,true);
      uVar11 = 0x800;
    }
    *(ushort *)&compBlock->field_0x18 = *(ushort *)&compBlock->field_0x18 | uVar11;
  }
  compBlock->next = pBVar5;
  pBVar5->prev = compBlock;
  compBlock->prev = targetBlock;
  targetBlock->next = compBlock;
  BasicBlock::RemoveSucc(targetBlock,targetBlock_00,this,false,false);
  AddEdge(this,targetBlock,compBlock);
  edge->predBlock = compBlock;
  pSVar15 = (Type)new<Memory::ArenaAllocator>(0x10,&this->alloc->super_ArenaAllocator,0x366bee);
  pSVar15[1].next = (Type)edge;
  pSVar15->next =
       (compBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  (compBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar15;
  pRVar1 = &(compBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  branchTarget = (LabelInstr *)targetBlock_00->firstInstr;
  IVar2 = (branchTarget->super_Instr).m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar9) goto LAB_0041be10;
    *puVar16 = 0;
  }
  func = (branchTarget->super_Instr).m_func;
  newLabelInstr = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(&this_00->super_Instr,&newLabelInstr->super_Instr);
  compBlock->firstInstr = &newLabelInstr->super_Instr;
  if (newLabelInstr->m_block != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                       "Overwriting existing block pointer");
    if (!bVar9) goto LAB_0041be10;
    *puVar16 = 0;
  }
  newLabelInstr->m_block = compBlock;
  this_01 = IR::BranchInstr::New(Br,branchTarget,func);
  IR::Instr::SetByteCodeOffset(&this_01->super_Instr,(Instr *)branchTarget);
  IR::Instr::InsertAfter(&newLabelInstr->super_Instr,&this_01->super_Instr);
  IR::Instr::SetByteCodeOffset(&newLabelInstr->super_Instr,(Instr *)branchTarget);
  if ((this_00->super_Instr).m_kind != InstrKindBranch) goto LAB_0041bd94;
  pLVar7 = this_00->m_branchTarget;
  if (pLVar7 == (LabelInstr *)0x0) {
    if (this_00->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      pcVar19 = "(m_isMultiBranch)";
      pcVar17 = "m_isMultiBranch";
      uVar20 = 0x20e;
      goto LAB_0041bbc5;
    }
  }
  else if (this_00->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    pcVar19 = "(!m_isMultiBranch)";
    pcVar17 = "!m_isMultiBranch";
    uVar20 = 0x209;
LAB_0041bbc5:
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,uVar20,pcVar19,pcVar17);
    if (!bVar9) goto LAB_0041be10;
    *puVar16 = 0;
  }
  if (pLVar7 != (LabelInstr *)0x0) {
    OVar3 = (this_00->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      bVar9 = OVar3 == MultiBr || OVar3 == Br;
    }
    else {
      bVar9 = LowererMD::IsUnconditionalBranch(&this_00->super_Instr);
    }
    if (bVar9 != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x945,"(sourceBr->IsMultiBranch() || sourceBr->IsConditional())",
                         "sourceBr->IsMultiBranch() || sourceBr->IsConditional()");
      if (!bVar9) goto LAB_0041be10;
      *puVar16 = 0;
    }
  }
  pLVar7 = this_00->m_branchTarget;
  if (pLVar7 == (LabelInstr *)0x0) {
    if (this_00->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      pcVar19 = "(m_isMultiBranch)";
      pcVar17 = "m_isMultiBranch";
      uVar20 = 0x20e;
      goto LAB_0041bd07;
    }
  }
  else if (this_00->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    pcVar19 = "(!m_isMultiBranch)";
    pcVar17 = "!m_isMultiBranch";
    uVar20 = 0x209;
LAB_0041bd07:
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,uVar20,pcVar19,pcVar17);
    if (!bVar9) goto LAB_0041be10;
    *puVar16 = 0;
  }
  if (pLVar7 == (LabelInstr *)0x0) {
    this_02 = IR::BranchInstr::AsMultiBrInstr(this_00);
    bVar9 = IR::MultiBranchInstr::ReplaceTarget(this_02,branchTarget,newLabelInstr);
    if (!bVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x949,"(replaced)","replaced");
      if (!bVar9) {
LAB_0041be10:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar16 = 0;
    }
  }
LAB_0041bd94:
  if (afterForward) {
    newLabelInstr->m_region = branchTarget->m_region;
  }
  else {
    BVar12 = Func::HasTry(this->func);
    if ((BVar12 != 0) &&
       ((bVar9 = Func::DoOptimizeTry(this->func), bVar9 ||
        (((EVar10 = JITTimeWorkItem::GetJitMode(this->func->m_workItem), EVar10 == SimpleJit &&
          ((this->func->field_0x240 & 0x10) != 0)) ||
         (bVar9 = Func::IsLoopBodyInTryFinally(this->func), bVar9)))))) {
      UpdateRegionForBlock(this,compBlock);
    }
  }
  return compBlock;
}

Assistant:

BasicBlock *
FlowGraph::InsertCompensationCodeForBlockMove(FlowEdge * edge,  bool insertToLoopList /*=false*/, bool sinkBlockLoop /*=false*/, bool afterForward /*=false*/)
{
    BasicBlock * compBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();
    BasicBlock * fallthroughBlock = sourceBlock->next;
    IR::Instr *  sourceLastInstr = sourceBlock->GetLastInstr();

    compBlock->SetBlockNum(this->blockCount++);

    if (insertToLoopList)
    {
        // For flow graph edits in
        if (sinkBlockLoop)
        {
            if (sinkBlock->loop && sinkBlock->loop->GetHeadBlock() == sinkBlock)
            {
                // BLUE 531255: sinkblock may be the head block of new loop, we shouldn't insert compensation block to that loop
                // Insert it to all the parent loop lists.
                compBlock->loop = sinkBlock->loop->parent;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false);
            }
            else
            {
                compBlock->loop = sinkBlock->loop;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false); // sinkBlock or fallthroughBlock?
            }
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSink = true;
#endif
        }
        else
        {
            compBlock->loop = sourceBlock->loop;
            InsertCompBlockToLoopList(compBlock->loop, compBlock, sourceBlock, true);
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSource = true;
#endif
        }
    }

    //
    // Fixup block linkage
    //

    // compensation block is inserted right after sourceBlock
    compBlock->next = fallthroughBlock;
    fallthroughBlock->prev = compBlock;

    compBlock->prev = sourceBlock;
    sourceBlock->next = compBlock;

    //
    // Fixup flow edges
    //
    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, compBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(compBlock);
    compBlock->AddSucc(edge, this);

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *compLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);
    sourceLastInstr->InsertAfter(compLabel);
    compBlock->SetFirstInstr(compLabel);
    compLabel->SetBasicBlock(compBlock);

    // Add br to sinkBlock from compensation block
    IR::BranchInstr *compBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    compBr->SetByteCodeOffset(sinkLabel);
    compLabel->InsertAfter(compBr);
    compBlock->SetLastInstr(compBr);

    compLabel->SetByteCodeOffset(sinkLabel);

    // Fixup flow out of sourceBlock
    if (sourceLastInstr->IsBranchInstr())
    {
        IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
        Assert(sourceBr->IsMultiBranch() || sourceBr->IsConditional());
        if (sourceBr->IsMultiBranch())
        {
            const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, compLabel);
            Assert(replaced);
        }
    }

    if (!afterForward)
    {
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
            (this->func->IsSimpleJit() && this->func->hasBailout) ||
            this->func->IsLoopBodyInTryFinally());

        if (assignRegionsBeforeGlobopt)
        {
            UpdateRegionForBlock(compBlock);
        }
    }
    else
    {
        compLabel->SetRegion(sinkLabel->GetRegion());
    }

    return compBlock;
}